

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O2

void __thiscall
lsim::gui::CircuitEditor::CircuitEditor(CircuitEditor *this,ModelCircuit *model_circuit)

{
  this->m_model_circuit = model_circuit;
  (this->m_widgets).
  super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_widgets).
  super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_widgets).
  super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_point_pin_lut)._M_h._M_buckets = &(this->m_point_pin_lut)._M_h._M_single_bucket;
  (this->m_point_pin_lut)._M_h._M_bucket_count = 1;
  (this->m_point_pin_lut)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_point_pin_lut)._M_h._M_element_count = 0;
  (this->m_point_pin_lut)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->m_hovered_widget = (ComponentWidget *)0x0;
  (this->m_point_pin_lut)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_point_pin_lut)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_selection).
  super__Vector_base<lsim::gui::CircuitEditor::SelectedItem,_std::allocator<lsim::gui::CircuitEditor::SelectedItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_selection).
  super__Vector_base<lsim::gui::CircuitEditor::SelectedItem,_std::allocator<lsim::gui::CircuitEditor::SelectedItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_selection).
  super__Vector_base<lsim::gui::CircuitEditor::SelectedItem,_std::allocator<lsim::gui::CircuitEditor::SelectedItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_area_sel_a).x = 0.0;
  (this->m_area_sel_a).y = 0.0;
  (this->m_copy_components).
  super__Vector_base<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::allocator<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_copy_components).
  super__Vector_base<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::allocator<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_state = CS_IDLE;
  (this->m_copy_components).
  super__Vector_base<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::allocator<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_copy_center).x = 0.0;
  (this->m_copy_center).y = 0.0;
  this->m_hovered_pin = 0xffffffffffffffff;
  this->m_hovered_wire = (ModelWire *)0x0;
  Point::Point(&this->m_scroll_delta,0.0,0.0);
  (this->m_wire_end).m_position.x = 0.0;
  (this->m_wire_end).m_position.y = 0.0;
  this->m_popup_component = (ComponentWidget *)0x0;
  (this->m_screen_offset).x = 0.0;
  (this->m_screen_offset).y = 0.0;
  (this->m_mouse_grid_point).x = 0.0;
  (this->m_mouse_grid_point).y = 0.0;
  (this->m_dragging_last_point).x = 0.0;
  (this->m_dragging_last_point).y = 0.0;
  (this->m_wire_start).m_position.x = 0.0;
  (this->m_wire_start).m_position.y = 0.0;
  (this->m_segment_start).x = 0.0;
  (this->m_segment_start).y = 0.0;
  (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)((long)&this->m_sim_circuit + 1) = 0;
  this->m_show_grid = true;
  return;
}

Assistant:

CircuitEditor::CircuitEditor(ModelCircuit *model_circuit) : 
			m_model_circuit(model_circuit),
			m_sim_circuit(nullptr),
			m_view_only(false),
			m_show_grid(true),
			m_scroll_delta(0,0),
			m_state(CS_IDLE),
			m_hovered_pin(PIN_ID_INVALID),
			m_hovered_widget(nullptr),
			m_hovered_wire(nullptr),
			m_popup_component(nullptr) {
}